

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS ref_phys_flip_twod_yz(REF_NODE ref_node,REF_INT ldim,REF_DBL *field)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 (*pauVar5) [16];
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar6 = 0;
  uVar8 = (ulong)((uint)((uint)ldim % 5 == 0) * 5);
  if (ldim < 6) {
    uVar8 = uVar6;
  }
  uVar7 = 6;
  if ((uint)ldim % 6 != 0) {
    uVar7 = uVar8;
  }
  if (ldim < 7) {
    uVar7 = uVar8;
  }
  iVar2 = ref_node->max;
  pauVar5 = (undefined1 (*) [16])(field + 2);
  for (; (long)uVar6 < (long)iVar2; uVar6 = uVar6 + 1) {
    if (-1 < ref_node->global[uVar6]) {
      if (4 < ldim) {
        auVar1 = *pauVar5;
        auVar3._8_4_ = auVar1._0_4_;
        auVar3._0_8_ = auVar1._8_8_;
        auVar3._12_4_ = auVar1._4_4_;
        *pauVar5 = auVar3;
      }
      if (uVar7 != 0) {
        auVar1 = *(undefined1 (*) [16])(*pauVar5 + uVar7 * 8);
        auVar4._8_4_ = auVar1._0_4_;
        auVar4._0_8_ = auVar1._8_8_;
        auVar4._12_4_ = auVar1._4_4_;
        *(undefined1 (*) [16])(*pauVar5 + uVar7 * 8) = auVar4;
      }
    }
    pauVar5 = (undefined1 (*) [16])(*pauVar5 + (long)ldim * 8);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_flip_twod_yz(REF_NODE ref_node, REF_INT ldim,
                                         REF_DBL *field) {
  REF_INT node;
  REF_DBL temp;
  REF_INT nequ;

  nequ = 0;
  if (ldim > 5 && 0 == ldim % 5) nequ = 5;
  if (ldim > 6 && 0 == ldim % 6) nequ = 6;

  each_ref_node_valid_node(ref_node, node) {
    if (ldim >= 5) {
      temp = field[2 + ldim * node];
      field[2 + ldim * node] = field[3 + ldim * node];
      field[3 + ldim * node] = temp;
    }
    if (nequ > 0) {
      temp = field[nequ + 2 + ldim * node];
      field[nequ + 2 + ldim * node] = field[nequ + 3 + ldim * node];
      field[nequ + 3 + ldim * node] = temp;
    }
  }

  return REF_SUCCESS;
}